

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O3

void __thiscall
spvtools::opt::IfConversion::HoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  pointer pOVar3;
  uint **ppuVar4;
  Instruction *pIVar5;
  bool bVar6;
  char cVar7;
  uint32_t a;
  uint32_t b;
  BasicBlock *pBVar8;
  mapped_type *ppBVar9;
  uint **ppuVar10;
  Instruction *pIVar11;
  pointer pOVar12;
  Instruction *pIVar13;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  uint *local_58;
  undefined1 local_50 [32];
  
  pBVar8 = IRContext::get_instr_block((this->super_Pass).context_,inst);
  if (pBVar8 == (BasicBlock *)0x0) {
    return;
  }
  if (target_block != (BasicBlock *)0x0) {
    pIVar13 = (pBVar8->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    b = 0;
    a = 0;
    if (pIVar13->has_result_id_ == true) {
      a = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
    }
    pIVar13 = (target_block->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar13->has_result_id_ == true) {
      b = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
    }
    bVar6 = DominatorTree::Dominates((DominatorTree *)dominators,a,b);
    if (bVar6) {
      return;
    }
  }
  bVar6 = Instruction::IsOpcodeCodeMotionSafe(inst);
  if (!bVar6) {
    __assert_fail("inst->IsOpcodeCodeMotionSafe() && \"Trying to move an instruction that is not safe to move.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp"
                  ,0xfa,
                  "void spvtools::opt::IfConversion::HoistInstruction(Instruction *, BasicBlock *, DominatorAnalysis *)"
                 );
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_50._8_8_ = 0;
  local_50._0_8_ = operator_new(0x20);
  *(IfConversion **)local_50._0_8_ = this;
  *(BasicBlock **)(local_50._0_8_ + 8) = target_block;
  *(DefUseManager **)(local_50._0_8_ + 0x10) = pDVar2;
  *(DominatorAnalysis **)(local_50._0_8_ + 0x18) = dominators;
  local_50._24_8_ =
       std::
       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
       ::_M_invoke;
  local_50._16_8_ =
       std::
       _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
       ::_M_manager;
  local_70 = 0;
  local_60 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
  pOVar12 = (inst->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_78._M_head_impl = (Instruction *)local_50;
  if (pOVar12 != pOVar3) {
    do {
      bVar6 = spvIsInIdType(pOVar12->type);
      if (bVar6) {
        ppuVar4 = (uint **)(pOVar12->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar10 = &(pOVar12->words).small_data_;
        if (ppuVar4 != (uint **)0x0) {
          ppuVar10 = ppuVar4;
        }
        local_58 = *ppuVar10;
        if (local_68 == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar7 = (*local_60)(&local_78,&local_58);
        if (cVar7 == '\0') break;
      }
      pOVar12 = pOVar12 + 1;
    } while (pOVar12 != pOVar3);
    if (local_68 == (code *)0x0) goto LAB_0021ab36;
  }
  (*local_68)(&local_78,&local_78,3);
LAB_0021ab36:
  if ((code *)local_50._16_8_ != (code *)0x0) {
    (*(code *)local_50._16_8_)(local_50,local_50,3);
  }
  pIVar13 = (target_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar13 == (Instruction *)0x0) ||
     ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  pIVar13 = (target_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  pIVar5 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
  pIVar11 = (Instruction *)0x0;
  if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    pIVar11 = pIVar5;
  }
  if (pIVar11->opcode_ == OpSelectionMerge) {
    pIVar13 = pIVar5;
  }
  if ((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != true) {
    pIVar5 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar5 != (Instruction *)0x0) {
      pIVar11 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar11;
      (pIVar11->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar5;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      local_78._M_head_impl = inst;
      Instruction::InsertBefore
                (pIVar13,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          *)&local_78);
      if (local_78._M_head_impl != (Instruction *)0x0) {
        (*((local_78._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        local_78._M_head_impl = inst;
        ppBVar9 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pIVar1->instr_to_block_,&local_78._M_head_impl);
        *ppBVar9 = target_block;
      }
      return;
    }
    __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xcc,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                 );
  }
  __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                ,0xca,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

void IfConversion::HoistInstruction(Instruction* inst, BasicBlock* target_block,
                                    DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return;
  }

  assert(inst->IsOpcodeCodeMotionSafe() &&
         "Trying to move an instruction that is not safe to move.");

  // First hoist all instructions it depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  inst->ForEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        HoistInstruction(operand_inst, target_block, dominators);
      });

  Instruction* insertion_pos = target_block->terminator();
  if ((insertion_pos)->PreviousNode()->opcode() == spv::Op::OpSelectionMerge) {
    insertion_pos = insertion_pos->PreviousNode();
  }
  inst->RemoveFromList();
  insertion_pos->InsertBefore(std::unique_ptr<Instruction>(inst));
  context()->set_instr_block(inst, target_block);
}